

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O0

void hpke_nonce(EVP_HPKE_CTX *ctx,uint8_t *out_nonce,size_t nonce_len)

{
  ulong local_38;
  size_t i_1;
  size_t i;
  uint64_t seq_copy;
  size_t nonce_len_local;
  uint8_t *out_nonce_local;
  EVP_HPKE_CTX *ctx_local;
  
  if (7 < nonce_len) {
    OPENSSL_memset(out_nonce,0,nonce_len);
    i = ctx->seq;
    for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
      out_nonce[(nonce_len - i_1) + -1] = (uint8_t)i;
      i = i >> 8;
    }
    for (local_38 = 0; local_38 < nonce_len; local_38 = local_38 + 1) {
      out_nonce[local_38] = out_nonce[local_38] ^ ctx->base_nonce[local_38];
    }
    return;
  }
  __assert_fail("nonce_len >= 8",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke.cc"
                ,1000,"void hpke_nonce(const EVP_HPKE_CTX *, uint8_t *, size_t)");
}

Assistant:

static void hpke_nonce(const EVP_HPKE_CTX *ctx, uint8_t *out_nonce,
                       size_t nonce_len) {
  assert(nonce_len >= 8);

  // Write padded big-endian bytes of |ctx->seq| to |out_nonce|.
  OPENSSL_memset(out_nonce, 0, nonce_len);
  uint64_t seq_copy = ctx->seq;
  for (size_t i = 0; i < 8; i++) {
    out_nonce[nonce_len - i - 1] = seq_copy & 0xff;
    seq_copy >>= 8;
  }

  // XOR the encoded sequence with the |ctx->base_nonce|.
  for (size_t i = 0; i < nonce_len; i++) {
    out_nonce[i] ^= ctx->base_nonce[i];
  }
}